

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsDatastore.cc
# Opt level: O0

void __thiscall LongReadsDatastore::LongReadsDatastore(LongReadsDatastore *this,WorkSpace *ws)

{
  initializer_list<ReadPosSize> __l;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  allocator_type *__a;
  vector<ReadPosSize,_std::allocator<ReadPosSize>_> *this_00;
  undefined6 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbe;
  uint8_t in_stack_ffffffffffffffbf;
  LongReadsDatastore *in_stack_ffffffffffffffc0;
  SequenceDistanceGraph *in_stack_ffffffffffffffc8;
  LongReadsMapper *in_stack_ffffffffffffffd0;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0;
  __a = (allocator_type *)(in_RDI + 2);
  ReadPosSize::ReadPosSize((ReadPosSize *)&stack0xffffffffffffffd0,0,0);
  this_00 = (vector<ReadPosSize,_std::allocator<ReadPosSize>_> *)&stack0xffffffffffffffcf;
  std::allocator<ReadPosSize>::allocator((allocator<ReadPosSize> *)0x3d3c3e);
  __l._M_array._6_1_ = in_stack_ffffffffffffffbe;
  __l._M_array._0_6_ = in_stack_ffffffffffffffb8;
  __l._M_array._7_1_ = in_stack_ffffffffffffffbf;
  __l._M_len = (size_type)in_stack_ffffffffffffffc0;
  std::vector<ReadPosSize,_std::allocator<ReadPosSize>_>::vector(this_00,__l,__a);
  std::allocator<ReadPosSize>::~allocator((allocator<ReadPosSize> *)0x3d3c63);
  std::__cxx11::string::string((string *)(in_RDI + 5));
  std::__cxx11::string::string((string *)(in_RDI + 9));
  std::__cxx11::string::string((string *)(in_RDI + 0xd));
  LongReadsMapper::LongReadsMapper
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffbf,(bool)in_stack_ffffffffffffffbe);
  return;
}

Assistant:

LongReadsDatastore::LongReadsDatastore(WorkSpace &ws) : filename(), ws(ws), mapper(ws.sdg, *this) {
}